

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t vi_change_case(EditLine *el,wint_t c)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t local_20;
  wchar_t i;
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_line).cursor < (el->el_line).lastchar) {
    cv_undo(el);
    for (local_20 = L'\0'; local_20 < (el->el_state).argument; local_20 = local_20 + L'\x01') {
      wVar2 = *(el->el_line).cursor;
      iVar1 = iswupper(wVar2);
      if (iVar1 == 0) {
        iVar1 = iswlower(wVar2);
        if (iVar1 != 0) {
          wVar2 = towupper(wVar2);
          *(el->el_line).cursor = wVar2;
        }
      }
      else {
        wVar2 = towlower(wVar2);
        *(el->el_line).cursor = wVar2;
      }
      pwVar3 = (el->el_line).cursor + 1;
      (el->el_line).cursor = pwVar3;
      if ((el->el_line).lastchar <= pwVar3) {
        (el->el_line).cursor = (el->el_line).cursor + -1;
        re_fastaddc(el);
        break;
      }
      re_fastaddc(el);
    }
    el_local._7_1_ = '\0';
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
vi_change_case(EditLine *el, wint_t c)
{
	int i;

	if (el->el_line.cursor >= el->el_line.lastchar)
		return CC_ERROR;
	cv_undo(el);
	for (i = 0; i < el->el_state.argument; i++) {

		c = *el->el_line.cursor;
		if (iswupper(c))
			*el->el_line.cursor = towlower(c);
		else if (iswlower(c))
			*el->el_line.cursor = towupper(c);

		if (++el->el_line.cursor >= el->el_line.lastchar) {
			el->el_line.cursor--;
			re_fastaddc(el);
			break;
		}
		re_fastaddc(el);
	}
	return CC_NORM;
}